

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

string * __thiscall
ast::GreaterThanOrEqual::toString_abi_cxx11_
          (string *__return_storage_ptr__,GreaterThanOrEqual *this)

{
  ostringstream local_190 [8];
  ostringstream msg;
  GreaterThanOrEqual *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"(");
  ast::operator<<((ostream *)local_190,(this->super_BinaryOp).LeftOp);
  std::operator<<((ostream *)local_190," >= ");
  ast::operator<<((ostream *)local_190,(this->super_BinaryOp).RightOp);
  std::operator<<((ostream *)local_190,")");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::GreaterThanOrEqual::toString() const
{
    std::ostringstream msg;
    msg << "(";
    msg << LeftOp;
    msg << " >= ";
    msg << RightOp;
    msg << ")";
    return msg.str();
}